

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int set_sort_compare(lyxp_set_nodes *item1,lyxp_set_nodes *item2,lyd_node *root)

{
  ushort uVar1;
  ushort uVar2;
  lyd_node *plVar3;
  LY_ERR *pLVar4;
  uint32_t attr_pos2;
  uint32_t attr_pos1;
  lyd_node *tmp_node;
  lyd_node *root_local;
  lyxp_set_nodes *item2_local;
  lyxp_set_nodes *item1_local;
  
  uVar1 = 0;
  uVar2 = 0;
  if (item1->pos < item2->pos) {
    item1_local._4_4_ = -1;
  }
  else if (item2->pos < item1->pos) {
    item1_local._4_4_ = 1;
  }
  else if ((item1->node == item2->node) && (item1->type != item2->type)) {
    if (item1->type == LYXP_NODE_ELEM) {
      if (item2->type != LYXP_NODE_TEXT) {
        __assert_fail("item2->type == LYXP_NODE_TEXT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                      ,0x4af,
                      "int set_sort_compare(struct lyxp_set_nodes *, struct lyxp_set_nodes *, const struct lyd_node *)"
                     );
      }
      item1_local._4_4_ = -1;
    }
    else {
      if ((item1->type != LYXP_NODE_TEXT) || (item2->type != LYXP_NODE_ELEM)) {
        __assert_fail("(item1->type == LYXP_NODE_TEXT) && (item2->type == LYXP_NODE_ELEM)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                      ,0x4b2,
                      "int set_sort_compare(struct lyxp_set_nodes *, struct lyxp_set_nodes *, const struct lyd_node *)"
                     );
      }
      item1_local._4_4_ = 1;
    }
  }
  else {
    if (item1->type == LYXP_NODE_ATTR) {
      plVar3 = lyd_attr_parent(root,(lyd_attr *)item1->node);
      if (plVar3 == (lyd_node *)0x0) {
        pLVar4 = ly_errno_location();
        *pLVar4 = LY_EINT;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
               ,0x4bb);
        return -1;
      }
      uVar1 = get_attr_pos((lyd_attr *)item1->node,plVar3);
    }
    if (item2->type == LYXP_NODE_ATTR) {
      plVar3 = lyd_attr_parent(root,(lyd_attr *)item2->node);
      if (plVar3 == (lyd_node *)0x0) {
        pLVar4 = ly_errno_location();
        *pLVar4 = LY_EINT;
        ly_log(LY_LLERR,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
               ,0x4c3);
        return -1;
      }
      uVar2 = get_attr_pos((lyd_attr *)item2->node,plVar3);
    }
    if (item1->node == item2->node) {
      if ((item1->type != item2->type) || ((item1->type == LYXP_NODE_ATTR && (uVar1 != uVar2)))) {
        __assert_fail("(item1->type == item2->type) && ((item1->type != LYXP_NODE_ATTR) || (attr_pos1 == attr_pos2))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                      ,0x4cc,
                      "int set_sort_compare(struct lyxp_set_nodes *, struct lyxp_set_nodes *, const struct lyd_node *)"
                     );
      }
      item1_local._4_4_ = 0;
    }
    else if (item1->type == LYXP_NODE_ELEM) {
      if (item2->type == LYXP_NODE_ELEM) {
        __assert_fail("item2->type != LYXP_NODE_ELEM",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/xpath.c"
                      ,0x4d3,
                      "int set_sort_compare(struct lyxp_set_nodes *, struct lyxp_set_nodes *, const struct lyd_node *)"
                     );
      }
      item1_local._4_4_ = -1;
    }
    else if ((((item1->type == LYXP_NODE_TEXT) &&
              ((item2->type == LYXP_NODE_ELEM || (item2->type == LYXP_NODE_ATTR)))) ||
             ((item1->type == LYXP_NODE_ATTR && (item2->type == LYXP_NODE_ELEM)))) ||
            (((item1->type == LYXP_NODE_ATTR && (item2->type == LYXP_NODE_ATTR)) && (uVar2 < uVar1))
            )) {
      item1_local._4_4_ = 1;
    }
    else {
      item1_local._4_4_ = -1;
    }
  }
  return item1_local._4_4_;
}

Assistant:

static int
set_sort_compare(struct lyxp_set_nodes *item1, struct lyxp_set_nodes *item2,
                 const struct lyd_node *root)
{
    const struct lyd_node *tmp_node;
    uint32_t attr_pos1 = 0, attr_pos2 = 0;

    if (item1->pos < item2->pos) {
        return -1;
    }

    if (item1->pos > item2->pos) {
        return 1;
    }

    /* node positions are equal, the fun case */

    /* 1st ELEM - == - 2nd TEXT, 1st TEXT - == - 2nd ELEM */
    /* special case since text nodes are actually saved as their parents */
    if ((item1->node == item2->node) && (item1->type != item2->type)) {
        if (item1->type == LYXP_NODE_ELEM) {
            assert(item2->type == LYXP_NODE_TEXT);
            return -1;
        } else {
            assert((item1->type == LYXP_NODE_TEXT) && (item2->type == LYXP_NODE_ELEM));
            return 1;
        }
    }

    /* we need attr positions now */
    if (item1->type == LYXP_NODE_ATTR) {
        tmp_node = lyd_attr_parent(root, (struct lyd_attr *)item1->node);
        if (!tmp_node) {
            LOGINT;
            return -1;
        }
        attr_pos1 = get_attr_pos((struct lyd_attr *)item1->node, tmp_node);
    }
    if (item2->type == LYXP_NODE_ATTR) {
        tmp_node = lyd_attr_parent(root, (struct lyd_attr *)item2->node);
        if (!tmp_node) {
            LOGINT;
            return -1;
        }
        attr_pos2 = get_attr_pos((struct lyd_attr *)item2->node, tmp_node);
    }

    /* 1st ROOT - 2nd ROOT, 1st ELEM - 2nd ELEM, 1st TEXT - 2nd TEXT, 1st ATTR - =pos= - 2nd ATTR */
    /* check for duplicates */
    if (item1->node == item2->node) {
        assert((item1->type == item2->type) && ((item1->type != LYXP_NODE_ATTR) || (attr_pos1 == attr_pos2)));
        return 0;
    }

    /* 1st ELEM - 2nd TEXT, 1st ELEM - any pos - 2nd ATTR */
    /* elem is always first, 2nd node is after it */
    if (item1->type == LYXP_NODE_ELEM) {
        assert(item2->type != LYXP_NODE_ELEM);
        return -1;
    }

    /* 1st TEXT - 2nd ELEM, 1st TEXT - any pos - 2nd ATTR, 1st ATTR - any pos - 2nd ELEM, 1st ATTR - >pos> - 2nd ATTR */
    /* 2nd is before 1st */
    if (((item1->type == LYXP_NODE_TEXT)
            && ((item2->type == LYXP_NODE_ELEM) || (item2->type == LYXP_NODE_ATTR)))
            || ((item1->type == LYXP_NODE_ATTR) && (item2->type == LYXP_NODE_ELEM))
            || (((item1->type == LYXP_NODE_ATTR) && (item2->type == LYXP_NODE_ATTR))
            && (attr_pos1 > attr_pos2))) {
        return 1;
    }

    /* 1st ATTR - any pos - 2nd TEXT, 1st ATTR <pos< - 2nd ATTR */
    /* 2nd is after 1st */
    return -1;
}